

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall
optTyped_swapNotEmptyWithEmpty_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
::~optTyped_swapNotEmptyWithEmpty_Test
          (optTyped_swapNotEmptyWithEmpty_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TYPED_TEST(optTyped, swapNotEmptyWithEmpty)
{
  using opt_type = typename TestFixture::type;
  opt_type o1{this->value_1};
  opt_type o2;
  std::swap(o1, o2);
  EXPECT_FALSE(o1);
  EXPECT_FALSE(o1.has_value());
  EXPECT_THROW(o1.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o1.value_or(this->value_2));
  EXPECT_TRUE(o2);
  EXPECT_TRUE(o2.has_value());
  EXPECT_EQ(this->value_1, *o2);
  EXPECT_EQ(this->value_1, o2.value());
  EXPECT_EQ(this->value_1, o2.value_or(this->value_2));
}